

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O3

size_t __thiscall adios2::format::BP4Serializer::CloseData(BP4Serializer *this,IO *io)

{
  _func_int **pp_Var1;
  iterator iVar2;
  undefined8 uVar3;
  _func_int *p_Var4;
  size_t sVar5;
  key_type local_88;
  string local_68;
  string local_48;
  
  p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"buffering","");
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var4),&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
  sVar5 = *(size_t *)(p_Var4 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  if ((&(this->super_BP4Base).field_0x270)[(long)p_Var4] == '\0') {
    if ((&(this->super_BP4Base).field_0x1c0)[(long)p_Var4] == '\x01') {
      SerializeDataBuffer(this,io);
      sVar5 = *(size_t *)
               ((this->super_BP4Base)._vptr_BP4Base[-3] + 0x20 +
               (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
    }
    SerializeMetadataInData(this,false,false);
    p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
    if ((&(this->super_BP4Base).field_0x2e8)[(long)p_Var4] == '\x01') {
      uVar3 = *(undefined8 *)
               (p_Var4 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"buffering","");
      iVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(&(this->super_BP4Base).field_0x2b0 + (long)p_Var4),&local_88);
      if (iVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar3 = std::__throw_out_of_range("_Map_base::at");
        _Unwind_Resume(uVar3);
      }
      *(undefined8 *)
       ((long)iVar2.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur + 0x28) = uVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
    }
    aggregator::MPIChain::Close((MPIChain *)(&(this->super_BP4Base).field_0x2f8 + (long)p_Var4));
    pp_Var1 = (this->super_BP4Base)._vptr_BP4Base;
    (&(this->super_BP4Base).field_0x270)[(long)pp_Var1[-3]] = 1;
    p_Var4 = pp_Var1[-3];
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"buffering","");
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var4),&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return sVar5;
}

Assistant:

size_t BP4Serializer::CloseData(core::IO &io)
{
    m_Profiler.Start("buffering");
    size_t dataEndsAt = m_Data.m_Position;
    if (!m_IsClosed)
    {
        if (m_MetadataSet.DataPGIsOpen)
        {
            SerializeDataBuffer(io);
        }
        dataEndsAt = m_Data.m_Position;

        SerializeMetadataInData(false, false);

        if (m_Profiler.m_IsActive)
        {
            m_Profiler.m_Bytes.at("buffering") = m_Data.m_AbsolutePosition;
        }

        m_Aggregator.Close();
        m_IsClosed = true;
    }

    m_Profiler.Stop("buffering");
    return dataEndsAt;
}